

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintdevice.cpp
# Opt level: O2

int __thiscall QPaintDevice::metric(QPaintDevice *this,PaintDeviceMetric m)

{
  uint uVar1;
  int iVar2;
  long in_FS_OFFSET;
  char local_40 [24];
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (m == PdmNumColors) {
    iVar2 = 0;
  }
  else if (m == PdmDevicePixelRatio) {
    iVar2 = 1;
  }
  else if (m == PdmDevicePixelRatioScaled) {
    iVar2 = (*this->_vptr_QPaintDevice[4])(this,0xb);
    iVar2 = iVar2 << 0x10;
  }
  else {
    local_40[0] = '\x02';
    local_40[1] = '\0';
    local_40[2] = '\0';
    local_40[3] = '\0';
    local_40[0x14] = '\0';
    local_40[0x15] = '\0';
    local_40[0x16] = '\0';
    local_40[0x17] = '\0';
    local_40[4] = '\0';
    local_40[5] = '\0';
    local_40[6] = '\0';
    local_40[7] = '\0';
    local_40[8] = '\0';
    local_40[9] = '\0';
    local_40[10] = '\0';
    local_40[0xb] = '\0';
    local_40[0xc] = '\0';
    local_40[0xd] = '\0';
    local_40[0xe] = '\0';
    local_40[0xf] = '\0';
    local_40[0x10] = '\0';
    local_40[0x11] = '\0';
    local_40[0x12] = '\0';
    local_40[0x13] = '\0';
    local_28 = "default";
    iVar2 = 0;
    QMessageLogger::warning(local_40,"QPaintDevice::metrics: Device has no metric information");
    uVar1 = m - PdmWidth;
    if ((uVar1 < 0xe) && ((0x33efU >> (uVar1 & 0x1f) & 1) != 0)) {
      iVar2 = *(int *)(&DAT_005ec2d8 + (ulong)uVar1 * 4);
    }
    else {
      local_40[0] = '\x02';
      local_40[1] = '\0';
      local_40[2] = '\0';
      local_40[3] = '\0';
      local_40[4] = '\0';
      local_40[5] = '\0';
      local_40[6] = '\0';
      local_40[7] = '\0';
      local_40[8] = '\0';
      local_40[9] = '\0';
      local_40[10] = '\0';
      local_40[0xb] = '\0';
      local_40[0xc] = '\0';
      local_40[0xd] = '\0';
      local_40[0xe] = '\0';
      local_40[0xf] = '\0';
      local_40[0x10] = '\0';
      local_40[0x11] = '\0';
      local_40[0x12] = '\0';
      local_40[0x13] = '\0';
      local_40[0x14] = '\0';
      local_40[0x15] = '\0';
      local_40[0x16] = '\0';
      local_40[0x17] = '\0';
      local_28 = "default";
      QMessageLogger::debug(local_40,"Unrecognized metric %d!",(ulong)m);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QPaintDevice::metric(PaintDeviceMetric m) const
{
    // Fallback: A subclass has not implemented PdmDevicePixelRatioScaled but might
    // have implemented PdmDevicePixelRatio.
    if (m == PdmDevicePixelRatioScaled)
        return this->metric(PdmDevicePixelRatio) * devicePixelRatioFScale();
    if (m == PdmNumColors)
        return 0;
    if (m == PdmDevicePixelRatio)
        return 1;

    qWarning("QPaintDevice::metrics: Device has no metric information");

    switch (m) {
    case PdmDevicePixelRatioScaled:
    case PdmDevicePixelRatio:
    case PdmNumColors:
        Q_UNREACHABLE();
        break;
    case PdmDpiX:
    case PdmDpiY:
        return 72;
    case PdmDevicePixelRatioF_EncodedA:
    case PdmDevicePixelRatioF_EncodedB:
        return 0;
    case PdmWidth:
    case PdmHeight:
    case PdmWidthMM:
    case PdmHeightMM:
    case PdmDepth:
    case PdmPhysicalDpiX:
    case PdmPhysicalDpiY:
        return 0;
    }
    qDebug("Unrecognized metric %d!", m);
    return 0;
}